

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall
mkvmuxer::Cluster::Cluster
          (Cluster *this,uint64_t timecode,int64_t cues_pos,uint64_t timecode_scale,
          bool write_last_frame_with_duration,bool fixed_size_timecode)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  
  *in_RDI = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(byte *)((long)in_RDI + 5) = in_R9B & 1;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *(undefined8 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = in_RDX;
  *(undefined8 *)(in_RDI + 6) = 0xffffffffffffffff;
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  *(undefined8 *)(in_RDI + 10) = in_RCX;
  *(byte *)(in_RDI + 0xc) = in_R8B & 1;
  std::
  map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
  ::map((map<unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::list<mkvmuxer::Frame_*,_std::allocator<mkvmuxer::Frame_*>_>_>_>_>
         *)0xdeae49);
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0xdeae57);
  *(undefined8 *)(in_RDI + 0x26) = 0;
  return;
}

Assistant:

Cluster::Cluster(uint64_t timecode, int64_t cues_pos, uint64_t timecode_scale,
                 bool write_last_frame_with_duration, bool fixed_size_timecode)
    : blocks_added_(0),
      finalized_(false),
      fixed_size_timecode_(fixed_size_timecode),
      header_written_(false),
      payload_size_(0),
      position_for_cues_(cues_pos),
      size_position_(-1),
      timecode_(timecode),
      timecode_scale_(timecode_scale),
      write_last_frame_with_duration_(write_last_frame_with_duration),
      writer_(NULL) {}